

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<CustomUintFormatter<6,false>>::
Ser<SizeComputer,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (VectorFormatter<CustomUintFormatter<6,false>> *this,SizeComputer *s,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  unsigned_long *puVar1;
  value_type_conflict *elem;
  unsigned_long *puVar2;
  long in_FS_OFFSET;
  CustomUintFormatter<6,_false> formatter;
  CustomUintFormatter<6,false> local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize(s,(long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    CustomUintFormatter<6,false>::Ser<SizeComputer,unsigned_long>(&local_29,s,*puVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }